

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuCommandLine.cpp
# Opt level: O2

CaseTreeNode * tcu::parseCaseList(istream *in)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  CaseTreeNode *this;
  CaseTreeNode *pCVar6;
  invalid_argument *piVar7;
  vector<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_> nodeStack;
  string curName;
  char *local_48;
  value_type local_40;
  CaseTreeNode *local_38;
  
  this = (CaseTreeNode *)operator_new(0x38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&curName,"",(allocator<char> *)&nodeStack);
  CaseTreeNode::CaseTreeNode(this,&curName);
  std::__cxx11::string::~string((string *)&curName);
  iVar3 = std::istream::peek();
  if (iVar3 == 0x7b) {
    nodeStack.super__Vector_base<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    nodeStack.super__Vector_base<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    nodeStack.super__Vector_base<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    curName._M_dataplus._M_p = (pointer)&curName.field_2;
    curName._M_string_length = 0;
    curName.field_2._M_local_buf[0] = '\0';
    local_40 = this;
    iVar3 = std::istream::get();
    if (iVar3 != 0x7b) {
      piVar7 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(piVar7,"Malformed case trie");
      __cxa_throw(piVar7,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
    std::vector<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_>::push_back
              (&nodeStack,&local_40);
    local_48 = "Missing node separator";
    bVar2 = true;
    while (nodeStack.super__Vector_base<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_>.
           _M_impl.super__Vector_impl_data._M_start !=
           nodeStack.super__Vector_base<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_>.
           _M_impl.super__Vector_impl_data._M_finish) {
      iVar3 = std::istream::get();
      if (((iVar3 == 0x2c) || (iVar3 == 0x7b)) || (iVar3 == 0x7d)) {
        bVar1 = iVar3 != 0x7d;
        if (curName._M_string_length == 0) {
          if (bVar2) {
            local_48 = "Empty node name";
            goto LAB_008cf956;
          }
        }
        else {
          if (!bVar2) {
LAB_008cf956:
            piVar7 = (invalid_argument *)__cxa_allocate_exception(0x10);
            std::invalid_argument::invalid_argument(piVar7,local_48);
LAB_008cf8da:
            __cxa_throw(piVar7,&std::invalid_argument::typeinfo,
                        std::invalid_argument::~invalid_argument);
          }
          pCVar6 = (CaseTreeNode *)operator_new(0x38);
          CaseTreeNode::CaseTreeNode(pCVar6,&curName);
          local_38 = pCVar6;
          CaseTreeNode::addChild
                    (nodeStack.
                     super__Vector_base<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_>.
                     _M_impl.super__Vector_impl_data._M_finish[-1],pCVar6);
          if (iVar3 == 0x7b) {
            std::vector<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_>::push_back
                      (&nodeStack,&local_38);
          }
          curName._M_string_length = 0;
          *curName._M_dataplus._M_p = '\0';
        }
        bVar2 = bVar1;
        if ((iVar3 == 0x7d) &&
           (nodeStack.super__Vector_base<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_>.
            _M_impl.super__Vector_impl_data._M_finish =
                 nodeStack.
                 super__Vector_base<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish + -1,
           nodeStack.super__Vector_base<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_>.
           _M_impl.super__Vector_impl_data._M_start ==
           nodeStack.super__Vector_base<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_>.
           _M_impl.super__Vector_impl_data._M_finish)) {
          iVar3 = std::istream::peek();
          if (iVar3 == 0xd) {
            std::istream::get();
          }
          iVar3 = std::istream::peek();
          if (iVar3 == 10) {
            std::istream::get();
          }
        }
      }
      else {
        if (iVar3 + 1U < 2) {
          piVar7 = (invalid_argument *)__cxa_allocate_exception(0x10);
          std::invalid_argument::invalid_argument(piVar7,"Unterminated case tree");
          goto LAB_008cf8da;
        }
        bVar1 = isValidTestCaseNameChar((char)iVar3);
        if (!bVar1) {
          piVar7 = (invalid_argument *)__cxa_allocate_exception(0x10);
          std::invalid_argument::invalid_argument(piVar7,"Illegal character in node name");
          goto LAB_008cf8da;
        }
        std::__cxx11::string::push_back((char)&curName);
      }
    }
  }
  else {
    nodeStack.super__Vector_base<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    nodeStack.super__Vector_base<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    nodeStack.super__Vector_base<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    curName._M_dataplus._M_p = (pointer)&curName.field_2;
    curName._M_string_length = 0;
    curName.field_2._M_local_buf[0] = '\0';
    local_40 = (CaseTreeNode *)0x0;
    std::vector<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_>::resize
              (&nodeStack,8,&local_40);
    *nodeStack.super__Vector_base<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_>._M_impl
     .super__Vector_impl_data._M_start = this;
    iVar3 = 0;
LAB_008cf683:
    do {
      while( true ) {
        iVar4 = std::istream::get();
        uVar5 = iVar4 + 1;
        if (uVar5 < 0x30) break;
LAB_008cf6ad:
        bVar2 = isValidTestCaseNameChar((char)iVar4);
        if (!bVar2) {
          piVar7 = (invalid_argument *)__cxa_allocate_exception(0x10);
          std::invalid_argument::invalid_argument(piVar7,"Illegal character in test case name");
LAB_008cf88e:
          __cxa_throw(piVar7,&std::invalid_argument::typeinfo,
                      std::invalid_argument::~invalid_argument);
        }
        std::__cxx11::string::push_back((char)&curName);
      }
      if ((0x4803UL >> ((ulong)uVar5 & 0x3f) & 1) == 0) {
        if ((ulong)uVar5 != 0x2f) goto LAB_008cf6ad;
        if (curName._M_string_length == 0) {
          piVar7 = (invalid_argument *)__cxa_allocate_exception(0x10);
          std::invalid_argument::invalid_argument(piVar7,"Empty test group name");
          goto LAB_008cf88e;
        }
        iVar4 = iVar3 + 1;
        if ((int)((ulong)((long)nodeStack.
                                super__Vector_base<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)nodeStack.
                               super__Vector_base<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 3) <= iVar4) {
          local_40 = (CaseTreeNode *)0x0;
          std::vector<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_>::resize
                    (&nodeStack,
                     (long)nodeStack.
                           super__Vector_base<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)nodeStack.
                           super__Vector_base<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 2,&local_40);
        }
        if ((nodeStack.super__Vector_base<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_>
             ._M_impl.super__Vector_impl_data._M_start[iVar4] == (CaseTreeNode *)0x0) ||
           (bVar2 = std::operator!=(&nodeStack.
                                     super__Vector_base<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_>
                                     ._M_impl.super__Vector_impl_data._M_start[iVar4]->m_name,
                                    &curName), bVar2)) {
          pCVar6 = CaseTreeNode::getChild
                             (nodeStack.
                              super__Vector_base<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_>
                              ._M_impl.super__Vector_impl_data._M_start[iVar3],&curName);
          if (pCVar6 == (CaseTreeNode *)0x0) {
            pCVar6 = (CaseTreeNode *)operator_new(0x38);
            CaseTreeNode::CaseTreeNode(pCVar6,&curName);
            CaseTreeNode::addChild
                      (nodeStack.
                       super__Vector_base<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_>
                       ._M_impl.super__Vector_impl_data._M_start[iVar3],pCVar6);
          }
          nodeStack.super__Vector_base<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_>.
          _M_impl.super__Vector_impl_data._M_start[iVar4] = pCVar6;
          if (iVar3 + 2 <
              (int)((ulong)((long)nodeStack.
                                  super__Vector_base<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)nodeStack.
                                 super__Vector_base<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 3)) {
            nodeStack.super__Vector_base<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_>.
            _M_impl.super__Vector_impl_data._M_start[iVar3 + 2] = (CaseTreeNode *)0x0;
          }
        }
        curName._M_string_length = 0;
        *curName._M_dataplus._M_p = '\0';
        iVar3 = iVar4;
        goto LAB_008cf683;
      }
      if (curName._M_string_length == 0) {
        piVar7 = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::invalid_argument::invalid_argument(piVar7,"Empty test case name");
        goto LAB_008cf88e;
      }
      bVar2 = CaseTreeNode::hasChild
                        (nodeStack.
                         super__Vector_base<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_>
                         ._M_impl.super__Vector_impl_data._M_start[iVar3],&curName);
      if (bVar2) {
        piVar7 = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::invalid_argument::invalid_argument(piVar7,"Duplicate test case");
        goto LAB_008cf88e;
      }
      pCVar6 = (CaseTreeNode *)operator_new(0x38);
      CaseTreeNode::CaseTreeNode(pCVar6,&curName);
      CaseTreeNode::addChild
                (nodeStack.
                 super__Vector_base<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_>.
                 _M_impl.super__Vector_impl_data._M_start[iVar3],pCVar6);
      curName._M_string_length = 0;
      *curName._M_dataplus._M_p = '\0';
      if ((iVar4 == 0xd) && (iVar3 = std::istream::peek(), iVar3 == 10)) {
        std::istream::get();
      }
      iVar4 = std::istream::peek();
      iVar3 = 0;
    } while (1 < iVar4 + 1U);
  }
  std::__cxx11::string::~string((string *)&curName);
  std::_Vector_base<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_>::~_Vector_base
            (&nodeStack.
              super__Vector_base<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_>);
  iVar3 = std::istream::get();
  if (1 < iVar3 + 1U) {
    piVar7 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar7,"Trailing characters at end of case list");
    __cxa_throw(piVar7,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  return this;
}

Assistant:

static CaseTreeNode* parseCaseList (std::istream& in)
{
	CaseTreeNode* const root = new CaseTreeNode("");
	try
	{
		if (in.peek() == '{')
			parseCaseTrie(root, in);
		else
			parseCaseList(root, in);

		{
			const int curChr = in.get();
			if (curChr != std::char_traits<char>::eof() && curChr != 0)
				throw std::invalid_argument("Trailing characters at end of case list");
		}

		return root;
	}
	catch (...)
	{
		delete root;
		throw;
	}
}